

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_bcon_new(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint32_t uVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  bson_t *pbVar16;
  undefined1 *puVar17;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar18;
  bson_t expected;
  undefined8 uStack_6a50;
  uint8_t *puStack_6a48;
  undefined1 *puStack_6a40;
  undefined1 auStack_6a30 [8];
  void *pvStack_6a28;
  undefined8 uStack_6a18;
  undefined8 uStack_6a10;
  char *pcStack_6a08;
  undefined8 uStack_69f0;
  undefined1 auStack_6980 [25944];
  void *pvStack_428;
  char *pcStack_420;
  char *pcStack_418;
  char *pcStack_410;
  code *pcStack_408;
  bson_t bStack_400;
  undefined1 auStack_380 [4];
  uint uStack_37c;
  undefined1 auStack_300 [336];
  void *pvStack_1b0;
  ulong uStack_1a8;
  undefined1 *puStack_1a0;
  ulong uStack_198;
  void *pvStack_190;
  code *pcStack_188;
  undefined1 auStack_180 [4];
  uint local_17c;
  
  puVar17 = auStack_180;
  pcStack_188 = (code *)0x13ac7a;
  bson_init(auStack_180);
  pcStack_188 = (code *)0x13aca1;
  bson_append_utf8(auStack_180,"hello",0xffffffff,"world",0xffffffff);
  pcStack_188 = (code *)0x13acb2;
  uVar4 = bcon_new(0,"hello","world",0);
  pcStack_188 = (code *)0x13acbd;
  pvVar5 = (void *)bson_get_data(uVar4);
  pcStack_188 = (code *)0x13acc8;
  pvVar6 = (void *)bson_get_data(auStack_180);
  if (local_17c == *(uint *)(uVar4 + 4)) {
    pcStack_188 = (code *)0x13ace1;
    pvVar7 = (void *)bson_get_data(auStack_180);
    pcStack_188 = (code *)0x13acec;
    pvVar8 = (void *)bson_get_data(uVar4);
    pcStack_188 = (code *)0x13acfc;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)local_17c);
    if (iVar1 == 0) {
      pcStack_188 = (code *)0x13ad08;
      bson_destroy(uVar4);
      pcStack_188 = (code *)0x13ad10;
      bson_destroy(auStack_180);
      return;
    }
  }
  pcStack_188 = (code *)0x13ad29;
  uVar9 = bson_as_canonical_extended_json(uVar4,0);
  pcStack_188 = (code *)0x13ad39;
  uVar10 = bson_as_canonical_extended_json(auStack_180,0);
  uVar2 = *(uint *)(uVar4 + 4);
  uVar3 = local_17c;
  if (uVar2 < local_17c) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar3 = local_17c;
    if (uVar2 <= local_17c) {
      uVar3 = uVar2;
    }
    lVar13 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar13) != *(char *)((long)pvVar6 + lVar13)) {
        uVar3 = (uint)lVar13;
        goto LAB_0013ad71;
      }
      lVar13 = lVar13 + 1;
    } while (uVar3 != (uint)lVar13);
  }
  uVar3 = 0xffffffff;
LAB_0013ad71:
  if (uVar2 < local_17c) {
    uVar2 = local_17c;
  }
  uVar2 = uVar2 - 1;
  if (uVar3 != 0xffffffff) {
    uVar2 = uVar3;
  }
  pcStack_188 = (code *)0x13ad9c;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar2,uVar9,uVar10);
  pcStack_188 = (code *)0x13adb4;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_188 = (code *)0x13adcf;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013ae17:
    pcStack_188 = (code *)0x13ae1c;
    test_bcon_new_cold_5();
LAB_0013ae1c:
    pcStack_188 = (code *)0x13ae21;
    test_bcon_new_cold_4();
LAB_0013ae21:
    pcStack_188 = (code *)0x13ae26;
    test_bcon_new_cold_1();
  }
  else {
    puVar17 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013ae1c;
    uVar4 = (ulong)*(uint *)(uVar4 + 4);
    pcStack_188 = (code *)0x13adef;
    uVar11 = write(uVar2,pvVar5,uVar4);
    if (uVar11 != uVar4) goto LAB_0013ae21;
    uVar4 = (ulong)local_17c;
    pcStack_188 = (code *)0x13ae07;
    uVar11 = write(uVar3,pvVar6,uVar4);
    if (uVar11 == uVar4) {
      pcStack_188 = (code *)0x13ae17;
      test_bcon_new_cold_3();
      goto LAB_0013ae17;
    }
  }
  pcStack_188 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar16 = &bStack_400;
  pcStack_408 = (code *)0x13ae4b;
  pvStack_1b0 = pvVar6;
  uStack_1a8 = (ulong)uVar2;
  puStack_1a0 = puVar17;
  uStack_198 = uVar4;
  pvStack_190 = pvVar5;
  pcStack_188 = (code *)&stack0xfffffffffffffff8;
  bson_init(&bStack_400);
  pcStack_408 = (code *)0x13ae5b;
  bson_init(auStack_380);
  pcStack_408 = (code *)0x13ae6b;
  bson_init(auStack_300);
  pcStack_408 = (code *)0x13ae8c;
  bson_append_utf8(auStack_300,"c",0xffffffff,"d",0xffffffff);
  pcStack_408 = (code *)0x13aeb3;
  bson_append_utf8(auStack_300,"e",0xffffffff,"f",0xffffffff);
  pcStack_408 = (code *)0x13aecd;
  bson_append_document(auStack_380,"a",0xffffffff,auStack_300);
  pcVar15 = "e";
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = "f";
  pvStack_428 = (void *)0x13af02;
  test_append_ctx_helper(&bStack_400,"a","{",0,"add magic");
  pcStack_408 = (code *)0x13af11;
  pvVar5 = (void *)bson_get_data(&bStack_400);
  pcStack_408 = (code *)0x13af1c;
  pvVar6 = (void *)bson_get_data(auStack_380);
  if (uStack_37c == bStack_400.len) {
    pcStack_408 = (code *)0x13af3a;
    pvVar7 = (void *)bson_get_data(auStack_380);
    pcStack_408 = (code *)0x13af45;
    pvVar8 = (void *)bson_get_data(&bStack_400);
    pcStack_408 = (code *)0x13af54;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_37c);
    if (iVar1 == 0) {
      pcStack_408 = (code *)0x13af60;
      bson_destroy(&bStack_400);
      pcStack_408 = (code *)0x13af6d;
      bson_destroy(auStack_380);
      pcStack_408 = (code *)0x13af7a;
      bson_destroy(auStack_300);
      return;
    }
  }
  pcStack_408 = (code *)0x13af96;
  uVar9 = bson_as_canonical_extended_json(&bStack_400,0);
  pcStack_408 = (code *)0x13afab;
  uVar10 = bson_as_canonical_extended_json(auStack_380,0);
  uVar12 = uStack_37c;
  if (bStack_400.len < uStack_37c) {
    uVar12 = bStack_400.len;
  }
  if (uVar12 != 0) {
    uVar12 = uStack_37c;
    if (bStack_400.len <= uStack_37c) {
      uVar12 = bStack_400.len;
    }
    lVar13 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar13) != *(char *)((long)pvVar6 + lVar13)) {
        uVar2 = (uint)lVar13;
        goto LAB_0013afe4;
      }
      lVar13 = lVar13 + 1;
    } while (uVar12 != (uint)lVar13);
  }
  uVar2 = 0xffffffff;
LAB_0013afe4:
  uVar3 = bStack_400.len;
  if (bStack_400.len < uStack_37c) {
    uVar3 = uStack_37c;
  }
  uVar3 = uVar3 - 1;
  if (uVar2 != 0xffffffff) {
    uVar3 = uVar2;
  }
  pcStack_408 = (code *)0x13b00f;
  uVar18 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3);
  pcStack_408 = (code *)0x13b027;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar14 = "failure.expected.bson";
  pvVar7 = (void *)0x42;
  pcStack_408 = (code *)0x13b042;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013b08e:
    pcStack_408 = (code *)0x13b093;
    test_append_ctx_cold_5();
LAB_0013b093:
    pcStack_408 = (code *)0x13b098;
    test_append_ctx_cold_4();
  }
  else {
    pbVar16 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013b093;
    pcVar14 = (char *)(ulong)uVar2;
    pcStack_408 = (code *)0x13b063;
    pvVar7 = pvVar5;
    uVar4 = write(uVar2,pvVar5,(ulong)bStack_400.len);
    if (uVar4 == bStack_400.len) {
      pvVar5 = (void *)(ulong)uStack_37c;
      pcStack_408 = (code *)0x13b07e;
      pvVar7 = pvVar6;
      pcVar14 = (char *)pbVar16;
      pvVar8 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
      if (pvVar8 != pvVar5) goto LAB_0013b09d;
      pvVar7 = (void *)(ulong)uVar3;
      pcStack_408 = (code *)0x13b08e;
      pcVar14 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013b08e;
    }
  }
  pcStack_408 = (code *)0x13b09d;
  test_append_ctx_cold_1();
LAB_0013b09d:
  pcStack_408 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_6a40 = auStack_6a30;
  if (extraout_AL != '\0') {
    uStack_69f0 = uVar18;
  }
  pvStack_6a28 = pvVar7;
  uStack_6a18 = uVar9;
  uStack_6a10 = uVar10;
  pcStack_6a08 = pcVar15;
  pvStack_428 = pvVar6;
  pcStack_420 = (char *)pbVar16;
  pcStack_418 = (char *)pvVar5;
  pcStack_410 = (char *)(ulong)uVar2;
  pcStack_408 = (code *)&pcStack_188;
  bcon_append_ctx_init(auStack_6980);
  puStack_6a48 = bStack_400.padding;
  uStack_6a50 = 0x3000000008;
  bcon_append_ctx_va(pcVar14,auStack_6980,&uStack_6a50);
  if ((uint)uStack_6a50 < 0x29) {
    uStack_6a50 = CONCAT44(uStack_6a50._4_4_,(uint)uStack_6a50 + 8);
  }
  else {
    puStack_6a48 = puStack_6a48 + 8;
  }
  bcon_append_ctx(pcVar14,auStack_6980,"c","d",0);
  bcon_append_ctx_va(pcVar14,auStack_6980,&uStack_6a50);
  return;
}

Assistant:

static void
test_bcon_new (void)
{
   bson_t expected;
   bson_t *bcon;

   bson_init (&expected);

   bson_append_utf8 (&expected, "hello", -1, "world", -1);
   bcon = BCON_NEW ("hello", "world");

   bson_eq_bson (bcon, &expected);

   bson_destroy (bcon);
   bson_destroy (&expected);
}